

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O3

UnaryOp * __thiscall verilogAST::UnaryOp::clone_impl(UnaryOp *this)

{
  UnOp UVar1;
  int iVar2;
  UnaryOp *pUVar3;
  undefined4 extraout_var;
  
  pUVar3 = (UnaryOp *)operator_new(0x18);
  iVar2 = (*(((this->operand)._M_t.
              super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
              .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node).
            _vptr_Node[3])();
  UVar1 = this->op;
  (pUVar3->super_Expression).super_Node._vptr_Node = (_func_int **)&PTR_toString_abi_cxx11__00175718
  ;
  (pUVar3->operand)._M_t.
  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>._M_t.
  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>.
  super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
       (Expression *)CONCAT44(extraout_var,iVar2);
  pUVar3->op = UVar1;
  return pUVar3;
}

Assistant:

virtual UnaryOp* clone_impl() const override {
    return new UnaryOp(this->operand->clone(), this->op);
  }